

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::EnumDescriptorProto::Clear(EnumDescriptorProto *this)

{
  bool bVar1;
  string *default_value;
  LogMessage *pLVar2;
  LogFinisher local_ca;
  byte local_c9;
  LogMessage local_c8;
  LogFinisher local_8d [20];
  byte local_79;
  LogMessage local_78;
  EnumDescriptorProto *local_40;
  EnumDescriptorProto *this_local;
  InternalMetadataWithArena *local_30;
  InternalMetadataWithArena *local_28;
  undefined4 local_1c;
  HasBits<1UL> *local_18;
  InternalMetadataWithArena *local_10;
  
  local_40 = this;
  RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::Clear(&this->value_);
  local_18 = &this->_has_bits_;
  local_1c = 0;
  if ((local_18->has_bits_[0] & 3) != 0) {
    bVar1 = has_name(this);
    if (bVar1) {
      default_value = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = internal::ArenaStringPtr::IsDefault(&this->name_,default_value);
      local_79 = 0;
      if (bVar1) {
        internal::LogMessage::LogMessage
                  (&local_78,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x1785);
        local_79 = 1;
        pLVar2 = internal::LogMessage::operator<<
                           (&local_78,
                            "CHECK failed: !name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(local_8d,pLVar2);
      }
      if ((local_79 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_78);
      }
      internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->name_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_options(this);
    if (bVar1) {
      local_c9 = 0;
      if (this->options_ == (EnumOptions *)0x0) {
        internal::LogMessage::LogMessage
                  (&local_c8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x1789);
        local_c9 = 1;
        pLVar2 = internal::LogMessage::operator<<(&local_c8,"CHECK failed: options_ != NULL: ");
        internal::LogFinisher::operator=(&local_ca,pLVar2);
      }
      if ((local_c9 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_c8);
      }
      EnumOptions::Clear(this->options_);
    }
  }
  this_local = (EnumDescriptorProto *)&this->_has_bits_;
  memset(this_local,0,4);
  local_30 = &this->_internal_metadata_;
  if (((uint)(local_30->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_28 = local_30;
    local_10 = local_30;
    internal::InternalMetadataWithArena::DoClear(local_30);
  }
  return;
}

Assistant:

void EnumDescriptorProto::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.EnumDescriptorProto)
  value_.Clear();
  if (_has_bits_[0 / 32] & 3u) {
    if (has_name()) {
      GOOGLE_DCHECK(!name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*name_.UnsafeRawStringPointer())->clear();
    }
    if (has_options()) {
      GOOGLE_DCHECK(options_ != NULL);
      options_->::google::protobuf::EnumOptions::Clear();
    }
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}